

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_134::
     genericCheckTestMessageAllZero<capnproto_test::capnp::test::TestAllTypes::Reader>
               (Reader reader)

{
  bool bVar1;
  float fVar2;
  double dVar3;
  Reader local_1ae8;
  uint local_1ab4;
  uint local_1ab0;
  bool local_1aa9;
  undefined1 local_1aa8 [7];
  bool _kj_shouldLog_59;
  uint local_1a74;
  uint local_1a70;
  DebugExpression<unsigned_int> local_1a6c;
  undefined1 local_1a68 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_59;
  uint local_1a14;
  uint local_1a10;
  bool local_1a09;
  undefined1 local_1a08 [7];
  bool _kj_shouldLog_58;
  uint local_19d4;
  uint local_19d0;
  DebugExpression<unsigned_int> local_19cc;
  undefined1 local_19c8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_58;
  uint local_1974;
  uint local_1970;
  bool local_1969;
  undefined1 local_1968 [7];
  bool _kj_shouldLog_57;
  uint local_1934;
  uint local_1930;
  DebugExpression<unsigned_int> local_192c;
  undefined1 local_1928 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_57;
  uint local_18d4;
  uint local_18d0;
  bool local_18c9;
  undefined1 local_18c8 [7];
  bool _kj_shouldLog_56;
  uint local_1894;
  uint local_1890;
  DebugExpression<unsigned_int> local_188c;
  undefined1 local_1888 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_56;
  uint local_1834;
  uint local_1830;
  bool local_1829;
  undefined1 local_1828 [7];
  bool _kj_shouldLog_55;
  uint local_17f4;
  uint local_17f0;
  DebugExpression<unsigned_int> local_17ec;
  undefined1 local_17e8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_55;
  uint local_1794;
  uint local_1790;
  bool local_1789;
  undefined1 local_1788 [7];
  bool _kj_shouldLog_54;
  uint local_1754;
  uint local_1750;
  DebugExpression<unsigned_int> local_174c;
  undefined1 local_1748 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_54;
  uint local_16f4;
  uint local_16f0;
  bool local_16e9;
  undefined1 local_16e8 [7];
  bool _kj_shouldLog_53;
  uint local_16b4;
  uint local_16b0;
  DebugExpression<unsigned_int> local_16ac;
  undefined1 local_16a8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_53;
  uint local_1654;
  uint local_1650;
  bool local_1649;
  undefined1 local_1648 [7];
  bool _kj_shouldLog_52;
  uint local_1614;
  uint local_1610;
  DebugExpression<unsigned_int> local_160c;
  undefined1 local_1608 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_52;
  uint local_15b4;
  uint local_15b0;
  bool local_15a9;
  undefined1 local_15a8 [7];
  bool _kj_shouldLog_51;
  uint local_1574;
  uint local_1570;
  DebugExpression<unsigned_int> local_156c;
  undefined1 local_1568 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_51;
  uint local_1514;
  uint local_1510;
  bool local_1509;
  undefined1 local_1508 [7];
  bool _kj_shouldLog_50;
  uint local_14d4;
  uint local_14d0;
  DebugExpression<unsigned_int> local_14cc;
  undefined1 local_14c8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_50;
  uint local_1474;
  uint local_1470;
  bool local_1469;
  undefined1 local_1468 [7];
  bool _kj_shouldLog_49;
  uint local_1434;
  uint local_1430;
  DebugExpression<unsigned_int> local_142c;
  undefined1 local_1428 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_49;
  uint local_13d4;
  uint local_13d0;
  bool local_13c9;
  undefined1 local_13c8 [7];
  bool _kj_shouldLog_48;
  uint local_1394;
  uint local_1390;
  DebugExpression<unsigned_int> local_138c;
  undefined1 local_1388 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_48;
  uint local_1334;
  uint local_1330;
  bool local_1329;
  undefined1 local_1328 [7];
  bool _kj_shouldLog_47;
  uint local_12f4;
  uint local_12f0;
  DebugExpression<unsigned_int> local_12ec;
  undefined1 local_12e8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_47;
  uint local_1294;
  uint local_1290;
  bool local_1289;
  undefined1 local_1288 [7];
  bool _kj_shouldLog_46;
  uint local_1254;
  uint local_1250;
  DebugExpression<unsigned_int> local_124c;
  undefined1 local_1248 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_46;
  uint local_11f4;
  uint local_11f0;
  bool local_11e9;
  undefined1 local_11e8 [7];
  bool _kj_shouldLog_45;
  uint local_11b4;
  uint local_11b0;
  DebugExpression<unsigned_int> local_11ac;
  undefined1 local_11a8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_45;
  uint local_1154;
  uint local_1150;
  bool local_1149;
  undefined1 local_1148 [7];
  bool _kj_shouldLog_44;
  uint local_1114;
  uint local_1110;
  DebugExpression<unsigned_int> local_110c;
  undefined1 local_1108 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_44;
  uint local_10b4;
  uint local_10b0;
  bool local_10a9;
  undefined1 local_10a8 [7];
  bool _kj_shouldLog_43;
  uint local_1074;
  uint local_1070;
  DebugExpression<unsigned_int> local_106c;
  undefined1 local_1068 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_43;
  uint local_1014;
  uint local_1010;
  bool local_1009;
  undefined1 local_1008 [7];
  bool _kj_shouldLog_42;
  uint local_fd4;
  uint local_fd0;
  DebugExpression<unsigned_int> local_fcc;
  undefined1 local_fc8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_42;
  uint local_f74;
  uint local_f70;
  bool local_f69;
  undefined1 local_f68 [7];
  bool _kj_shouldLog_41;
  uint local_f34;
  uint local_f30;
  DebugExpression<unsigned_int> local_f2c;
  undefined1 local_f28 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_41;
  uint local_ed4;
  uint local_ed0;
  bool local_ec9;
  undefined1 local_ec8 [7];
  bool _kj_shouldLog_40;
  uint local_e94;
  uint local_e90;
  DebugExpression<unsigned_int> local_e8c;
  undefined1 local_e88 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_40;
  uint local_e34;
  uint local_e30;
  bool local_e29;
  undefined1 local_e28 [7];
  bool _kj_shouldLog_39;
  uint local_df4;
  uint local_df0;
  DebugExpression<unsigned_int> local_dec;
  undefined1 local_de8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_39;
  uint local_d94;
  uint local_d90;
  bool local_d89;
  undefined1 local_d88 [7];
  bool _kj_shouldLog_38;
  uint local_d54;
  uint local_d50;
  DebugExpression<unsigned_int> local_d4c;
  undefined1 local_d48 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_38;
  uint local_cf4;
  uint local_cf0;
  bool local_ce9;
  undefined1 local_ce8 [7];
  bool _kj_shouldLog_37;
  uint local_cb4;
  uint local_cb0;
  DebugExpression<unsigned_int> local_cac;
  undefined1 local_ca8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_37;
  uint local_c54;
  uint local_c50;
  bool local_c49;
  undefined1 local_c48 [7];
  bool _kj_shouldLog_36;
  uint local_c14;
  uint local_c10;
  DebugExpression<unsigned_int> local_c0c;
  undefined1 local_c08 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_36;
  uint local_bb4;
  uint local_bb0;
  bool local_ba9;
  undefined1 local_ba8 [7];
  bool _kj_shouldLog_35;
  uint local_b74;
  uint local_b70;
  DebugExpression<unsigned_int> local_b6c;
  undefined1 local_b68 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_35;
  uint local_b14;
  uint local_b10;
  bool local_b09;
  undefined1 local_b08 [7];
  bool _kj_shouldLog_34;
  uint local_ad4;
  uint local_ad0;
  DebugExpression<unsigned_int> local_acc;
  undefined1 local_ac8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_34;
  uint local_a74;
  uint local_a70;
  bool local_a69;
  undefined1 local_a68 [7];
  bool _kj_shouldLog_33;
  uint local_a34;
  uint local_a30;
  DebugExpression<unsigned_int> local_a2c;
  undefined1 local_a28 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_33;
  uint local_9d4;
  uint local_9d0;
  bool local_9c9;
  undefined1 local_9c8 [7];
  bool _kj_shouldLog_32;
  uint local_994;
  uint local_990;
  DebugExpression<unsigned_int> local_98c;
  undefined1 local_988 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_32;
  uint local_934;
  uint local_930;
  bool local_929;
  undefined1 local_928 [7];
  bool _kj_shouldLog_31;
  uint local_8f4;
  uint local_8f0;
  DebugExpression<unsigned_int> local_8ec;
  undefined1 local_8e8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_31;
  uint local_894;
  uint local_890;
  bool local_889;
  undefined1 local_888 [7];
  bool _kj_shouldLog_30;
  uint local_854;
  uint local_850;
  DebugExpression<unsigned_int> local_84c;
  undefined1 local_848 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_30;
  ArrayPtr<const_char> local_7f8;
  bool local_7e1;
  undefined1 local_7e0 [7];
  bool _kj_shouldLog_29;
  ArrayPtr<const_char> local_7b0;
  char (*local_7a0) [1];
  undefined1 local_798 [8];
  DebugComparison<const_char_(&)[1],_capnp::Text::Reader> _kjCondition_29;
  bool local_751;
  undefined1 auStack_750 [7];
  bool _kj_shouldLog_28;
  char (*local_740) [1];
  undefined1 local_738 [8];
  DebugComparison<const_char_(&)[1],_capnp::Text::Reader> _kjCondition_28;
  Reader subSubReader;
  ArrayPtr<const_unsigned_char> local_6c8;
  bool local_6b1;
  undefined1 auStack_6b0 [7];
  bool _kj_shouldLog_27;
  ArrayPtr<const_unsigned_char> local_6a0;
  ArrayPtr<const_unsigned_char> local_690;
  undefined1 local_680 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> _kjCondition_27;
  bool local_631;
  undefined1 auStack_630 [7];
  bool _kj_shouldLog_26;
  char (*local_620) [1];
  undefined1 local_618 [8];
  DebugComparison<const_char_(&)[1],_capnp::Text::Reader> _kjCondition_26;
  double local_5e0;
  bool local_5d7;
  bool local_5d6;
  DebugExpression<bool> local_5d5;
  int local_5d4;
  bool _kj_shouldLog_25;
  float fStack_5d0;
  DebugExpression<bool> _kjCondition_25;
  bool local_5cb;
  bool local_5ca;
  DebugExpression<bool> local_5c9;
  bool _kj_shouldLog_24;
  uint64_t uStack_5c8;
  DebugExpression<bool> _kjCondition_24;
  uint local_5c0;
  bool local_5b9;
  uint64_t uStack_5b8;
  bool _kj_shouldLog_23;
  uint local_5b0;
  DebugExpression<unsigned_int> local_5ac;
  undefined1 local_5a8 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_23;
  bool local_575;
  uint32_t local_574;
  uint uStack_570;
  bool _kj_shouldLog_22;
  DebugExpression<unsigned_int> local_56c;
  undefined1 local_568 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_22;
  uint local_540;
  bool local_53b;
  uint16_t local_53a;
  uint local_538;
  bool _kj_shouldLog_21;
  DebugExpression<unsigned_int> DStack_534;
  undefined1 local_530 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_21;
  uint local_508;
  bool local_502;
  uint8_t local_501;
  uint local_500;
  bool _kj_shouldLog_20;
  DebugExpression<unsigned_int> DStack_4fc;
  undefined1 local_4f8 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_20;
  int local_4d0;
  bool local_4c9;
  int64_t iStack_4c8;
  bool _kj_shouldLog_19;
  int local_4c0;
  DebugExpression<int> local_4bc;
  undefined1 local_4b8 [8];
  DebugComparison<int,_long> _kjCondition_19;
  bool local_485;
  int32_t local_484;
  int iStack_480;
  bool _kj_shouldLog_18;
  DebugExpression<int> local_47c;
  undefined1 local_478 [8];
  DebugComparison<int,_int> _kjCondition_18;
  int local_450;
  bool local_44b;
  int16_t local_44a;
  int local_448;
  bool _kj_shouldLog_17;
  DebugExpression<int> DStack_444;
  undefined1 local_440 [8];
  DebugComparison<int,_short> _kjCondition_17;
  int local_418;
  bool local_412;
  int8_t local_411;
  int local_410;
  bool _kj_shouldLog_16;
  DebugExpression<int> DStack_40c;
  undefined1 local_408 [8];
  DebugComparison<int,_signed_char> _kjCondition_16;
  undefined1 local_3e0 [4];
  bool _kj_shouldLog_15;
  DebugComparison<bool,_bool> _kjCondition_15;
  bool _kj_shouldLog_14;
  DebugExpression<const_capnp::Void_&> DStack_3b8;
  undefined1 local_3b0 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition_14;
  Reader subReader;
  ArrayPtr<const_unsigned_char> local_348;
  bool local_331;
  undefined1 auStack_330 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_unsigned_char> local_320;
  ArrayPtr<const_unsigned_char> local_310;
  undefined1 local_300 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> _kjCondition_13;
  bool local_2b1;
  undefined1 auStack_2b0 [7];
  bool _kj_shouldLog_12;
  char (*local_2a0) [1];
  undefined1 local_298 [8];
  DebugComparison<const_char_(&)[1],_capnp::Text::Reader> _kjCondition_12;
  double local_260;
  bool local_257;
  bool local_256;
  DebugExpression<bool> local_255;
  int local_254;
  bool _kj_shouldLog_11;
  float fStack_250;
  DebugExpression<bool> _kjCondition_11;
  bool local_24b;
  bool local_24a;
  DebugExpression<bool> local_249;
  bool _kj_shouldLog_10;
  uint64_t uStack_248;
  DebugExpression<bool> _kjCondition_10;
  uint local_240;
  bool local_239;
  uint64_t uStack_238;
  bool _kj_shouldLog_9;
  uint local_230;
  DebugExpression<unsigned_int> local_22c;
  undefined1 local_228 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_9;
  bool local_1f5;
  uint32_t local_1f4;
  uint uStack_1f0;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int> local_1ec;
  undefined1 local_1e8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  uint local_1c0;
  bool local_1bb;
  uint16_t local_1ba;
  uint local_1b8;
  bool _kj_shouldLog_7;
  DebugExpression<unsigned_int> DStack_1b4;
  undefined1 local_1b0 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_7;
  uint local_188;
  bool local_182;
  uint8_t local_181;
  uint local_180;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int> DStack_17c;
  undefined1 local_178 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_6;
  int local_150;
  bool local_149;
  int64_t iStack_148;
  bool _kj_shouldLog_5;
  int local_140;
  DebugExpression<int> local_13c;
  undefined1 local_138 [8];
  DebugComparison<int,_long> _kjCondition_5;
  bool local_105;
  int32_t local_104;
  int iStack_100;
  bool _kj_shouldLog_4;
  DebugExpression<int> local_fc;
  undefined1 local_f8 [8];
  DebugComparison<int,_int> _kjCondition_4;
  int local_d0;
  bool local_cb;
  int16_t local_ca;
  int local_c8;
  bool _kj_shouldLog_3;
  DebugExpression<int> DStack_c4;
  undefined1 local_c0 [8];
  DebugComparison<int,_short> _kjCondition_3;
  int local_98;
  bool local_92;
  int8_t local_91;
  int local_90;
  bool _kj_shouldLog_2;
  DebugExpression<int> DStack_8c;
  undefined1 local_88 [8];
  DebugComparison<int,_signed_char> _kjCondition_2;
  undefined1 local_60 [4];
  bool _kj_shouldLog_1;
  DebugComparison<bool,_bool> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<const_capnp::Void_&> DStack_38;
  undefined1 local_30 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition;
  
  DStack_38 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)&stack0x00000008);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,
             (DebugExpression<capnp::Void_const&> *)&stack0xffffffffffffffc8,
             (Void *)&_kjCondition_1.field_0x1f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    _kjCondition_1._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._29_1_ != '\0') {
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c4,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.getVoidField())\", _kjCondition, VOID, reader.getVoidField()"
                 ,(char (*) [51])"failed: expected (VOID) == (reader.getVoidField())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,(Void *)&VOID,
                 (Void *)&_kjCondition_1.field_0x1c);
      _kjCondition_1._29_1_ = 0;
    }
  }
  _kjCondition_2._30_1_ = 0;
  _kjCondition_2._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x1e);
  _kjCondition_2._29_1_ =
       capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField((Reader *)&stack0x00000008);
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_60,
             (DebugExpression<bool> *)&_kjCondition_2.field_0x1f,(bool *)&_kjCondition_2.field_0x1d)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar1) {
    _kjCondition_2._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._28_1_ != '\0') {
      _kjCondition_2._27_1_ = 0;
      _kjCondition_2._26_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c5,ERROR,
                 "\"failed: expected \" \"(false) == (reader.getBoolField())\", _kjCondition, false, reader.getBoolField()"
                 ,(char (*) [52])"failed: expected (false) == (reader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_60,(bool *)&_kjCondition_2.field_0x1b,
                 (bool *)&_kjCondition_2.field_0x1a);
      _kjCondition_2._28_1_ = 0;
    }
  }
  local_90 = 0;
  DStack_8c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
  local_91 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                       ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_88,&stack0xffffffffffffff74,&local_91);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  if (!bVar1) {
    local_92 = kj::_::Debug::shouldLog(ERROR);
    while (local_92 != false) {
      local_98 = 0;
      _kjCondition_3._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c6,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt8Field())\", _kjCondition, 0, reader.getInt8Field()"
                 ,(char (*) [48])"failed: expected (0) == (reader.getInt8Field())",
                 (DebugComparison<int,_signed_char> *)local_88,&local_98,&_kjCondition_3.field_0x1f)
      ;
      local_92 = false;
    }
  }
  local_c8 = 0;
  DStack_c4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c8);
  local_ca = capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                       ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_c0,&stack0xffffffffffffff3c,&local_ca);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
  if (!bVar1) {
    local_cb = kj::_::Debug::shouldLog(ERROR);
    while (local_cb != false) {
      local_d0 = 0;
      _kjCondition_4._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c7,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt16Field())\", _kjCondition, 0, reader.getInt16Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt16Field())",
                 (DebugComparison<int,_short> *)local_c0,&local_d0,
                 (short *)&_kjCondition_4.field_0x1e);
      local_cb = false;
    }
  }
  iStack_100 = 0;
  local_fc = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff00);
  local_104 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                        ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_f8,&local_fc,&local_104);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
  if (!bVar1) {
    local_105 = kj::_::Debug::shouldLog(ERROR);
    while (local_105 != false) {
      _kjCondition_5._36_4_ = 0;
      _kjCondition_5._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c8,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt32Field())\", _kjCondition, 0, reader.getInt32Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt32Field())",
                 (DebugComparison<int,_int> *)local_f8,(int *)&_kjCondition_5.field_0x24,
                 (int *)&_kjCondition_5.result);
      local_105 = false;
    }
  }
  local_140 = 0;
  local_13c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_140);
  iStack_148 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                         ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_138,&local_13c,&stack0xfffffffffffffeb8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    local_149 = kj::_::Debug::shouldLog(ERROR);
    while (local_149 != false) {
      local_150 = 0;
      _kjCondition_6._24_8_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c9,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt64Field())\", _kjCondition, 0, reader.getInt64Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt64Field())",
                 (DebugComparison<int,_long> *)local_138,&local_150,(long *)&_kjCondition_6.result);
      local_149 = false;
    }
  }
  local_180 = 0;
  DStack_17c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_180);
  local_181 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                        ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_178,&stack0xfffffffffffffe84,
             &local_181);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_178);
  if (!bVar1) {
    local_182 = kj::_::Debug::shouldLog(ERROR);
    while (local_182 != false) {
      local_188 = 0;
      _kjCondition_7._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[50],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ca,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt8Field())\", _kjCondition, 0u, reader.getUInt8Field()"
                 ,(char (*) [50])"failed: expected (0u) == (reader.getUInt8Field())",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_178,&local_188,
                 &_kjCondition_7.field_0x1f);
      local_182 = false;
    }
  }
  local_1b8 = 0;
  DStack_1b4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1b8);
  local_1ba = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                        ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_1b0,&stack0xfffffffffffffe4c,
             &local_1ba);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b0);
  if (!bVar1) {
    local_1bb = kj::_::Debug::shouldLog(ERROR);
    while (local_1bb != false) {
      local_1c0 = 0;
      _kjCondition_8._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cb,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt16Field())\", _kjCondition, 0u, reader.getUInt16Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt16Field())",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_1b0,&local_1c0,
                 (unsigned_short *)&_kjCondition_8.field_0x1e);
      local_1bb = false;
    }
  }
  uStack_1f0 = 0;
  local_1ec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe10);
  local_1f4 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                        ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1e8,&local_1ec,&local_1f4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
  if (!bVar1) {
    local_1f5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f5 != false) {
      _kjCondition_9._36_4_ = 0;
      _kjCondition_9._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cc,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt32Field())\", _kjCondition, 0u, reader.getUInt32Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt32Field())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1e8,
                 (uint *)&_kjCondition_9.field_0x24,(uint *)&_kjCondition_9.result);
      local_1f5 = false;
    }
  }
  local_230 = 0;
  local_22c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_230);
  uStack_238 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                         ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_228,&local_22c,
             &stack0xfffffffffffffdc8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_228);
  if (!bVar1) {
    local_239 = kj::_::Debug::shouldLog(ERROR);
    while (local_239 != false) {
      local_240 = 0;
      uStack_248 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                             ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cd,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt64Field())\", _kjCondition, 0u, reader.getUInt64Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt64Field())",
                 (DebugComparison<unsigned_int,_unsigned_long> *)local_228,&local_240,
                 &stack0xfffffffffffffdb8);
      local_239 = false;
    }
  }
  fVar2 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                    ((Reader *)&stack0x00000008);
  local_24a = kj::_::floatAlmostEqual(fVar2,0.0);
  local_249 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_24a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_249);
  if (!bVar1) {
    local_24b = kj::_::Debug::shouldLog(ERROR);
    while (local_24b != false) {
      fStack_250 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                             ((Reader *)&stack0x00000008);
      local_254 = 0;
      kj::_::Debug::log<char_const(&)[72],kj::_::DebugExpression<bool>&,float,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ce,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)\", _kjCondition, reader.getFloat32Field(), 0"
                 ,(char (*) [72])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)",
                 &local_249,&stack0xfffffffffffffdb0,&local_254);
      local_24b = false;
    }
  }
  dVar3 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                    ((Reader *)&stack0x00000008);
  local_256 = kj::_::doubleAlmostEqual(dVar3,0.0);
  local_255 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_256);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_255);
  if (!bVar1) {
    local_257 = kj::_::Debug::shouldLog(ERROR);
    while (local_257 != false) {
      local_260 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                            ((Reader *)&stack0x00000008);
      _kjCondition_12._44_4_ = 0;
      kj::_::Debug::log<char_const(&)[73],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cf,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)\", _kjCondition, reader.getFloat64Field(), 0"
                 ,(char (*) [73])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)",
                 &local_255,&local_260,(int *)&_kjCondition_12.field_0x2c);
      local_257 = false;
    }
  }
  local_2a0 = (char (*) [1])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [1])0x4adbe2);
  _auStack_2b0 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)local_298,
             (DebugExpression<char_const(&)[1]> *)&local_2a0,(Reader *)auStack_2b0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_298);
  if (!bVar1) {
    local_2b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b1 != false) {
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Reader>&,char_const(&)[1],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d0,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (reader.getTextField())\", _kjCondition, \"\", reader.getTextField()"
                 ,(char (*) [49])"failed: expected (\"\") == (reader.getTextField())",
                 (DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)local_298,
                 (char (*) [1])0x4adbe2,(Reader *)&_kjCondition_13.result);
      local_2b1 = false;
    }
  }
  local_320 = (ArrayPtr<const_unsigned_char>)_::data("");
  local_310 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_320);
  _auStack_330 = (ArrayPtr<const_unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                           ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_300,
             (DebugExpression<capnp::Data::Reader> *)&local_310,(Reader *)auStack_330);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_300);
  if (!bVar1) {
    local_331 = kj::_::Debug::shouldLog(ERROR);
    while (local_331 != false) {
      local_348 = (ArrayPtr<const_unsigned_char>)_::data("");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d1,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (reader.getDataField())\", _kjCondition, data(\"\"), reader.getDataField()"
                 ,(char (*) [55])"failed: expected (data(\"\")) == (reader.getDataField())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_300,
                 (Reader *)&local_348,(Reader *)&subReader._reader.nestingLimit);
      local_331 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)&_kjCondition_14.result,(Reader *)&stack0x00000008);
  DStack_3b8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)&_kjCondition_14.result)
  ;
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_3b0,
             (DebugExpression<capnp::Void_const&> *)&stack0xfffffffffffffc48,
             (Void *)&_kjCondition_15.field_0x1f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3b0);
  if (!bVar1) {
    _kjCondition_15._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_15._29_1_ != '\0') {
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField
                ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d4,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.getVoidField())\", _kjCondition, VOID, subReader.getVoidField()"
                 ,(char (*) [54])"failed: expected (VOID) == (subReader.getVoidField())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_3b0,(Void *)&VOID,
                 (Void *)&_kjCondition_15.field_0x1c);
      _kjCondition_15._29_1_ = 0;
    }
  }
  _kjCondition_16._30_1_ = 0;
  _kjCondition_16._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_16.field_0x1e);
  _kjCondition_16._29_1_ =
       capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField
                 ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_3e0,
             (DebugExpression<bool> *)&_kjCondition_16.field_0x1f,
             (bool *)&_kjCondition_16.field_0x1d);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3e0);
  if (!bVar1) {
    _kjCondition_16._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_16._28_1_ != '\0') {
      _kjCondition_16._27_1_ = 0;
      _kjCondition_16._26_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[55],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d5,ERROR,
                 "\"failed: expected \" \"(false) == (subReader.getBoolField())\", _kjCondition, false, subReader.getBoolField()"
                 ,(char (*) [55])"failed: expected (false) == (subReader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_3e0,(bool *)&_kjCondition_16.field_0x1b,
                 (bool *)&_kjCondition_16.field_0x1a);
      _kjCondition_16._28_1_ = 0;
    }
  }
  local_410 = 0;
  DStack_40c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_410);
  local_411 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_408,&stack0xfffffffffffffbf4,&local_411);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_408);
  if (!bVar1) {
    local_412 = kj::_::Debug::shouldLog(ERROR);
    while (local_412 != false) {
      local_418 = 0;
      _kjCondition_17._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d6,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt8Field())\", _kjCondition, 0, subReader.getInt8Field()"
                 ,(char (*) [51])"failed: expected (0) == (subReader.getInt8Field())",
                 (DebugComparison<int,_signed_char> *)local_408,&local_418,
                 &_kjCondition_17.field_0x1f);
      local_412 = false;
    }
  }
  local_448 = 0;
  DStack_444 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_448);
  local_44a = capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_440,&stack0xfffffffffffffbbc,&local_44a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_440);
  if (!bVar1) {
    local_44b = kj::_::Debug::shouldLog(ERROR);
    while (local_44b != false) {
      local_450 = 0;
      _kjCondition_18._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d7,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt16Field())\", _kjCondition, 0, subReader.getInt16Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt16Field())",
                 (DebugComparison<int,_short> *)local_440,&local_450,
                 (short *)&_kjCondition_18.field_0x1e);
      local_44b = false;
    }
  }
  iStack_480 = 0;
  local_47c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffb80);
  local_484 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_478,&local_47c,&local_484);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_478);
  if (!bVar1) {
    local_485 = kj::_::Debug::shouldLog(ERROR);
    while (local_485 != false) {
      _kjCondition_19._36_4_ = 0;
      _kjCondition_19._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d8,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt32Field())\", _kjCondition, 0, subReader.getInt32Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt32Field())",
                 (DebugComparison<int,_int> *)local_478,(int *)&_kjCondition_19.field_0x24,
                 (int *)&_kjCondition_19.result);
      local_485 = false;
    }
  }
  local_4c0 = 0;
  local_4bc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4c0);
  iStack_4c8 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                         ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_4b8,&local_4bc,&stack0xfffffffffffffb38);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4b8);
  if (!bVar1) {
    local_4c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4c9 != false) {
      local_4d0 = 0;
      _kjCondition_20._24_8_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d9,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt64Field())\", _kjCondition, 0, subReader.getInt64Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt64Field())",
                 (DebugComparison<int,_long> *)local_4b8,&local_4d0,(long *)&_kjCondition_20.result)
      ;
      local_4c9 = false;
    }
  }
  local_500 = 0;
  DStack_4fc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_500);
  local_501 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_4f8,&stack0xfffffffffffffb04,
             &local_501);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4f8);
  if (!bVar1) {
    local_502 = kj::_::Debug::shouldLog(ERROR);
    while (local_502 != false) {
      local_508 = 0;
      _kjCondition_21._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[53],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1da,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt8Field())\", _kjCondition, 0u, subReader.getUInt8Field()"
                 ,(char (*) [53])"failed: expected (0u) == (subReader.getUInt8Field())",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_4f8,&local_508,
                 &_kjCondition_21.field_0x1f);
      local_502 = false;
    }
  }
  local_538 = 0;
  DStack_534 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_538);
  local_53a = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_530,&stack0xfffffffffffffacc,
             &local_53a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_530);
  if (!bVar1) {
    local_53b = kj::_::Debug::shouldLog(ERROR);
    while (local_53b != false) {
      local_540 = 0;
      _kjCondition_22._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1db,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt16Field())\", _kjCondition, 0u, subReader.getUInt16Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt16Field())",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_530,&local_540,
                 (unsigned_short *)&_kjCondition_22.field_0x1e);
      local_53b = false;
    }
  }
  uStack_570 = 0;
  local_56c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffa90);
  local_574 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_568,&local_56c,&local_574);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_568);
  if (!bVar1) {
    local_575 = kj::_::Debug::shouldLog(ERROR);
    while (local_575 != false) {
      _kjCondition_23._36_4_ = 0;
      _kjCondition_23._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1dc,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt32Field())\", _kjCondition, 0u, subReader.getUInt32Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt32Field())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_568,
                 (uint *)&_kjCondition_23.field_0x24,(uint *)&_kjCondition_23.result);
      local_575 = false;
    }
  }
  local_5b0 = 0;
  local_5ac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5b0);
  uStack_5b8 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                         ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_5a8,&local_5ac,
             &stack0xfffffffffffffa48);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5a8);
  if (!bVar1) {
    local_5b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5b9 != false) {
      local_5c0 = 0;
      uStack_5c8 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                             ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1dd,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt64Field())\", _kjCondition, 0u, subReader.getUInt64Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt64Field())",
                 (DebugComparison<unsigned_int,_unsigned_long> *)local_5a8,&local_5c0,
                 &stack0xfffffffffffffa38);
      local_5b9 = false;
    }
  }
  fVar2 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                    ((Reader *)&_kjCondition_14.result);
  local_5ca = kj::_::floatAlmostEqual(fVar2,0.0);
  local_5c9 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5ca);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_5c9);
  if (!bVar1) {
    local_5cb = kj::_::Debug::shouldLog(ERROR);
    while (local_5cb != false) {
      fStack_5d0 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                             ((Reader *)&_kjCondition_14.result);
      local_5d4 = 0;
      kj::_::Debug::log<char_const(&)[75],kj::_::DebugExpression<bool>&,float,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1de,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)\", _kjCondition, subReader.getFloat32Field(), 0"
                 ,(char (*) [75])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)",
                 &local_5c9,&stack0xfffffffffffffa30,&local_5d4);
      local_5cb = false;
    }
  }
  dVar3 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                    ((Reader *)&_kjCondition_14.result);
  local_5d6 = kj::_::doubleAlmostEqual(dVar3,0.0);
  local_5d5 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5d6);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_5d5);
  if (!bVar1) {
    local_5d7 = kj::_::Debug::shouldLog(ERROR);
    while (local_5d7 != false) {
      local_5e0 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                            ((Reader *)&_kjCondition_14.result);
      _kjCondition_26._44_4_ = 0;
      kj::_::Debug::log<char_const(&)[76],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1df,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)\", _kjCondition, subReader.getFloat64Field(), 0"
                 ,(char (*) [76])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)",
                 &local_5d5,&local_5e0,(int *)&_kjCondition_26.field_0x2c);
      local_5d7 = false;
    }
  }
  local_620 = (char (*) [1])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [1])0x4adbe2);
  _auStack_630 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)local_618,
             (DebugExpression<char_const(&)[1]> *)&local_620,(Reader *)auStack_630);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_618);
  if (!bVar1) {
    local_631 = kj::_::Debug::shouldLog(ERROR);
    while (local_631 != false) {
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Reader>&,char_const(&)[1],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e0,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subReader.getTextField())\", _kjCondition, \"\", subReader.getTextField()"
                 ,(char (*) [52])"failed: expected (\"\") == (subReader.getTextField())",
                 (DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)local_618,
                 (char (*) [1])0x4adbe2,(Reader *)&_kjCondition_27.result);
      local_631 = false;
    }
  }
  local_6a0 = (ArrayPtr<const_unsigned_char>)_::data("");
  local_690 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_6a0);
  _auStack_6b0 = (ArrayPtr<const_unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                           ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_680,
             (DebugExpression<capnp::Data::Reader> *)&local_690,(Reader *)auStack_6b0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_680);
  if (!bVar1) {
    local_6b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6b1 != false) {
      local_6c8 = (ArrayPtr<const_unsigned_char>)_::data("");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e1,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.getDataField())\", _kjCondition, data(\"\"), subReader.getDataField()"
                 ,(char (*) [58])"failed: expected (data(\"\")) == (subReader.getDataField())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_680,
                 (Reader *)&local_6c8,(Reader *)&subSubReader._reader.nestingLimit);
      local_6b1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)&_kjCondition_28.result,(Reader *)&_kjCondition_14.result);
  local_740 = (char (*) [1])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [1])0x4adbe2);
  _auStack_750 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)&_kjCondition_28.result);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)local_738,
             (DebugExpression<char_const(&)[1]> *)&local_740,(Reader *)auStack_750);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_738);
  if (!bVar1) {
    local_751 = kj::_::Debug::shouldLog(ERROR);
    while (local_751 != false) {
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                     ((Reader *)&_kjCondition_28.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Reader>&,char_const(&)[1],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e4,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getTextField())\", _kjCondition, \"\", subSubReader.getTextField()"
                 ,(char (*) [55])"failed: expected (\"\") == (subSubReader.getTextField())",
                 (DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)local_738,
                 (char (*) [1])0x4adbe2,(Reader *)&_kjCondition_29.result);
      local_751 = false;
    }
  }
  local_7a0 = (char (*) [1])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [1])0x4adbe2);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)local_7e0,(Reader *)&_kjCondition_28.result);
  local_7b0 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)local_7e0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)local_798,
             (DebugExpression<char_const(&)[1]> *)&local_7a0,(Reader *)&local_7b0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_798);
  if (!bVar1) {
    local_7e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7e1 != false) {
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
                ((Reader *)&_kjCondition_30.result,(Reader *)&_kjCondition_28.result);
      local_7f8 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                            ((Reader *)&_kjCondition_30.result);
      kj::_::Debug::
      log<char_const(&)[72],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Reader>&,char_const(&)[1],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e5,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getStructField().getTextField())\", _kjCondition, \"\", subSubReader.getStructField().getTextField()"
                 ,(char (*) [72])
                  "failed: expected (\"\") == (subSubReader.getStructField().getTextField())",
                 (DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)local_798,
                 (char (*) [1])0x4adbe2,(Reader *)&local_7f8);
      local_7e1 = false;
    }
  }
  local_850 = 0;
  local_84c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_850);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
            ((Reader *)local_888,(Reader *)&_kjCondition_14.result);
  local_854 = List<capnp::Void,_(capnp::Kind)0>::Reader::size((Reader *)local_888);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_848,&local_84c,&local_854);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_848);
  if (!bVar1) {
    local_889 = kj::_::Debug::shouldLog(ERROR);
    while (local_889 != false) {
      local_890 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
                ((Reader *)&_kjCondition_31.result,(Reader *)&_kjCondition_14.result);
      local_894 = List<capnp::Void,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_31.result)
      ;
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e8,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getVoidList().size())\", _kjCondition, 0u, subReader.getVoidList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getVoidList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_848,&local_890,&local_894);
      local_889 = false;
    }
  }
  local_8f0 = 0;
  local_8ec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_8f0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList
            ((Reader *)local_928,(Reader *)&_kjCondition_14.result);
  local_8f4 = List<bool,_(capnp::Kind)0>::Reader::size((Reader *)local_928);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_8e8,&local_8ec,&local_8f4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8e8);
  if (!bVar1) {
    local_929 = kj::_::Debug::shouldLog(ERROR);
    while (local_929 != false) {
      local_930 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList
                ((Reader *)&_kjCondition_32.result,(Reader *)&_kjCondition_14.result);
      local_934 = List<bool,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_32.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e9,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getBoolList().size())\", _kjCondition, 0u, subReader.getBoolList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getBoolList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_8e8,&local_930,&local_934);
      local_929 = false;
    }
  }
  local_990 = 0;
  local_98c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_990);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List
            ((Reader *)local_9c8,(Reader *)&_kjCondition_14.result);
  local_994 = List<signed_char,_(capnp::Kind)0>::Reader::size((Reader *)local_9c8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_988,&local_98c,&local_994);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_988);
  if (!bVar1) {
    local_9c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_9c9 != false) {
      local_9d0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List
                ((Reader *)&_kjCondition_33.result,(Reader *)&_kjCondition_14.result);
      local_9d4 = List<signed_char,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_33.result)
      ;
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ea,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt8List().size())\", _kjCondition, 0u, subReader.getInt8List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getInt8List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_988,&local_9d0,&local_9d4);
      local_9c9 = false;
    }
  }
  local_a30 = 0;
  local_a2c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a30);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
            ((Reader *)local_a68,(Reader *)&_kjCondition_14.result);
  local_a34 = List<short,_(capnp::Kind)0>::Reader::size((Reader *)local_a68);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_a28,&local_a2c,&local_a34);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a28);
  if (!bVar1) {
    local_a69 = kj::_::Debug::shouldLog(ERROR);
    while (local_a69 != false) {
      local_a70 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
                ((Reader *)&_kjCondition_34.result,(Reader *)&_kjCondition_14.result);
      local_a74 = List<short,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_34.result);
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1eb,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt16List().size())\", _kjCondition, 0u, subReader.getInt16List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt16List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_a28,&local_a70,&local_a74);
      local_a69 = false;
    }
  }
  local_ad0 = 0;
  local_acc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ad0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
            ((Reader *)local_b08,(Reader *)&_kjCondition_14.result);
  local_ad4 = List<int,_(capnp::Kind)0>::Reader::size((Reader *)local_b08);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_ac8,&local_acc,&local_ad4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ac8);
  if (!bVar1) {
    local_b09 = kj::_::Debug::shouldLog(ERROR);
    while (local_b09 != false) {
      local_b10 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
                ((Reader *)&_kjCondition_35.result,(Reader *)&_kjCondition_14.result);
      local_b14 = List<int,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_35.result);
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ec,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt32List().size())\", _kjCondition, 0u, subReader.getInt32List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_ac8,&local_b10,&local_b14);
      local_b09 = false;
    }
  }
  local_b70 = 0;
  local_b6c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b70);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
            ((Reader *)local_ba8,(Reader *)&_kjCondition_14.result);
  local_b74 = List<long,_(capnp::Kind)0>::Reader::size((Reader *)local_ba8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_b68,&local_b6c,&local_b74);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b68);
  if (!bVar1) {
    local_ba9 = kj::_::Debug::shouldLog(ERROR);
    while (local_ba9 != false) {
      local_bb0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
                ((Reader *)&_kjCondition_36.result,(Reader *)&_kjCondition_14.result);
      local_bb4 = List<long,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_36.result);
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ed,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt64List().size())\", _kjCondition, 0u, subReader.getInt64List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_b68,&local_bb0,&local_bb4);
      local_ba9 = false;
    }
  }
  local_c10 = 0;
  local_c0c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c10);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
            ((Reader *)local_c48,(Reader *)&_kjCondition_14.result);
  local_c14 = List<unsigned_char,_(capnp::Kind)0>::Reader::size((Reader *)local_c48);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_c08,&local_c0c,&local_c14);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c08);
  if (!bVar1) {
    local_c49 = kj::_::Debug::shouldLog(ERROR);
    while (local_c49 != false) {
      local_c50 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
                ((Reader *)&_kjCondition_37.result,(Reader *)&_kjCondition_14.result);
      local_c54 = List<unsigned_char,_(capnp::Kind)0>::Reader::size
                            ((Reader *)&_kjCondition_37.result);
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ee,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt8List().size())\", _kjCondition, 0u, subReader.getUInt8List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getUInt8List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_c08,&local_c50,&local_c54);
      local_c49 = false;
    }
  }
  local_cb0 = 0;
  local_cac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_cb0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
            ((Reader *)local_ce8,(Reader *)&_kjCondition_14.result);
  local_cb4 = List<unsigned_short,_(capnp::Kind)0>::Reader::size((Reader *)local_ce8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_ca8,&local_cac,&local_cb4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ca8);
  if (!bVar1) {
    local_ce9 = kj::_::Debug::shouldLog(ERROR);
    while (local_ce9 != false) {
      local_cf0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
                ((Reader *)&_kjCondition_38.result,(Reader *)&_kjCondition_14.result);
      local_cf4 = List<unsigned_short,_(capnp::Kind)0>::Reader::size
                            ((Reader *)&_kjCondition_38.result);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ef,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt16List().size())\", _kjCondition, 0u, subReader.getUInt16List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt16List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_ca8,&local_cf0,&local_cf4);
      local_ce9 = false;
    }
  }
  local_d50 = 0;
  local_d4c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d50);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
            ((Reader *)local_d88,(Reader *)&_kjCondition_14.result);
  local_d54 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_d88);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_d48,&local_d4c,&local_d54);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d48);
  if (!bVar1) {
    local_d89 = kj::_::Debug::shouldLog(ERROR);
    while (local_d89 != false) {
      local_d90 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
                ((Reader *)&_kjCondition_39.result,(Reader *)&_kjCondition_14.result);
      local_d94 = List<unsigned_int,_(capnp::Kind)0>::Reader::size
                            ((Reader *)&_kjCondition_39.result);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f0,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt32List().size())\", _kjCondition, 0u, subReader.getUInt32List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_d48,&local_d90,&local_d94);
      local_d89 = false;
    }
  }
  local_df0 = 0;
  local_dec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_df0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
            ((Reader *)local_e28,(Reader *)&_kjCondition_14.result);
  local_df4 = List<unsigned_long,_(capnp::Kind)0>::Reader::size((Reader *)local_e28);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_de8,&local_dec,&local_df4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_de8);
  if (!bVar1) {
    local_e29 = kj::_::Debug::shouldLog(ERROR);
    while (local_e29 != false) {
      local_e30 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
                ((Reader *)&_kjCondition_40.result,(Reader *)&_kjCondition_14.result);
      local_e34 = List<unsigned_long,_(capnp::Kind)0>::Reader::size
                            ((Reader *)&_kjCondition_40.result);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f1,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt64List().size())\", _kjCondition, 0u, subReader.getUInt64List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_de8,&local_e30,&local_e34);
      local_e29 = false;
    }
  }
  local_e90 = 0;
  local_e8c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e90);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
            ((Reader *)local_ec8,(Reader *)&_kjCondition_14.result);
  local_e94 = List<float,_(capnp::Kind)0>::Reader::size((Reader *)local_ec8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_e88,&local_e8c,&local_e94);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e88);
  if (!bVar1) {
    local_ec9 = kj::_::Debug::shouldLog(ERROR);
    while (local_ec9 != false) {
      local_ed0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
                ((Reader *)&_kjCondition_41.result,(Reader *)&_kjCondition_14.result);
      local_ed4 = List<float,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_41.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f2,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getFloat32List().size())\", _kjCondition, 0u, subReader.getFloat32List().size()"
                 ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_e88,&local_ed0,&local_ed4);
      local_ec9 = false;
    }
  }
  local_f30 = 0;
  local_f2c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f30);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
            ((Reader *)local_f68,(Reader *)&_kjCondition_14.result);
  local_f34 = List<double,_(capnp::Kind)0>::Reader::size((Reader *)local_f68);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_f28,&local_f2c,&local_f34);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f28);
  if (!bVar1) {
    local_f69 = kj::_::Debug::shouldLog(ERROR);
    while (local_f69 != false) {
      local_f70 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
                ((Reader *)&_kjCondition_42.result,(Reader *)&_kjCondition_14.result);
      local_f74 = List<double,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_42.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,499,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getFloat64List().size())\", _kjCondition, 0u, subReader.getFloat64List().size()"
                 ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_f28,&local_f70,&local_f74);
      local_f69 = false;
    }
  }
  local_fd0 = 0;
  local_fcc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_fd0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getTextList
            ((Reader *)local_1008,(Reader *)&_kjCondition_14.result);
  local_fd4 = List<capnp::Text,_(capnp::Kind)1>::Reader::size((Reader *)local_1008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_fc8,&local_fcc,&local_fd4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_fc8);
  if (!bVar1) {
    local_1009 = kj::_::Debug::shouldLog(ERROR);
    while (local_1009 != false) {
      local_1010 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getTextList
                ((Reader *)&_kjCondition_43.result,(Reader *)&_kjCondition_14.result);
      local_1014 = List<capnp::Text,_(capnp::Kind)1>::Reader::size
                             ((Reader *)&_kjCondition_43.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,500,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getTextList().size())\", _kjCondition, 0u, subReader.getTextList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getTextList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_fc8,&local_1010,&local_1014);
      local_1009 = false;
    }
  }
  local_1070 = 0;
  local_106c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1070);
  capnproto_test::capnp::test::TestAllTypes::Reader::getDataList
            ((Reader *)local_10a8,(Reader *)&_kjCondition_14.result);
  local_1074 = List<capnp::Data,_(capnp::Kind)1>::Reader::size((Reader *)local_10a8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1068,&local_106c,&local_1074);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1068);
  if (!bVar1) {
    local_10a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_10a9 != false) {
      local_10b0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getDataList
                ((Reader *)&_kjCondition_44.result,(Reader *)&_kjCondition_14.result);
      local_10b4 = List<capnp::Data,_(capnp::Kind)1>::Reader::size
                             ((Reader *)&_kjCondition_44.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f5,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getDataList().size())\", _kjCondition, 0u, subReader.getDataList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getDataList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1068,&local_10b0,&local_10b4);
      local_10a9 = false;
    }
  }
  local_1110 = 0;
  local_110c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1110);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)local_1148,(Reader *)&_kjCondition_14.result);
  local_1114 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                         ((Reader *)local_1148);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1108,&local_110c,&local_1114);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1108);
  if (!bVar1) {
    local_1149 = kj::_::Debug::shouldLog(ERROR);
    while (local_1149 != false) {
      local_1150 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
                ((Reader *)&_kjCondition_45.result,(Reader *)&_kjCondition_14.result);
      local_1154 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                             ((Reader *)&_kjCondition_45.result);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f6,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getStructList().size())\", _kjCondition, 0u, subReader.getStructList().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getStructList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1108,&local_1150,&local_1154);
      local_1149 = false;
    }
  }
  local_11b0 = 0;
  local_11ac = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_11b0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
            ((Reader *)local_11e8,(Reader *)&stack0x00000008);
  local_11b4 = List<capnp::Void,_(capnp::Kind)0>::Reader::size((Reader *)local_11e8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_11a8,&local_11ac,&local_11b4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_11a8);
  if (!bVar1) {
    local_11e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_11e9 != false) {
      local_11f0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
                ((Reader *)&_kjCondition_46.result,(Reader *)&stack0x00000008);
      local_11f4 = List<capnp::Void,_(capnp::Kind)0>::Reader::size
                             ((Reader *)&_kjCondition_46.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f9,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getVoidList().size())\", _kjCondition, 0u, reader.getVoidList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getVoidList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_11a8,&local_11f0,&local_11f4);
      local_11e9 = false;
    }
  }
  local_1250 = 0;
  local_124c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1250);
  capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList
            ((Reader *)local_1288,(Reader *)&stack0x00000008);
  local_1254 = List<bool,_(capnp::Kind)0>::Reader::size((Reader *)local_1288);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1248,&local_124c,&local_1254);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1248);
  if (!bVar1) {
    local_1289 = kj::_::Debug::shouldLog(ERROR);
    while (local_1289 != false) {
      local_1290 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList
                ((Reader *)&_kjCondition_47.result,(Reader *)&stack0x00000008);
      local_1294 = List<bool,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_47.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fa,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getBoolList().size())\", _kjCondition, 0u, reader.getBoolList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getBoolList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1248,&local_1290,&local_1294);
      local_1289 = false;
    }
  }
  local_12f0 = 0;
  local_12ec = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_12f0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List
            ((Reader *)local_1328,(Reader *)&stack0x00000008);
  local_12f4 = List<signed_char,_(capnp::Kind)0>::Reader::size((Reader *)local_1328);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_12e8,&local_12ec,&local_12f4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_12e8);
  if (!bVar1) {
    local_1329 = kj::_::Debug::shouldLog(ERROR);
    while (local_1329 != false) {
      local_1330 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List
                ((Reader *)&_kjCondition_48.result,(Reader *)&stack0x00000008);
      local_1334 = List<signed_char,_(capnp::Kind)0>::Reader::size
                             ((Reader *)&_kjCondition_48.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fb,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt8List().size())\", _kjCondition, 0u, reader.getInt8List().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getInt8List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_12e8,&local_1330,&local_1334);
      local_1329 = false;
    }
  }
  local_1390 = 0;
  local_138c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1390);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
            ((Reader *)local_13c8,(Reader *)&stack0x00000008);
  local_1394 = List<short,_(capnp::Kind)0>::Reader::size((Reader *)local_13c8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1388,&local_138c,&local_1394);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1388);
  if (!bVar1) {
    local_13c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_13c9 != false) {
      local_13d0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
                ((Reader *)&_kjCondition_49.result,(Reader *)&stack0x00000008);
      local_13d4 = List<short,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_49.result);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fc,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt16List().size())\", _kjCondition, 0u, reader.getInt16List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt16List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1388,&local_13d0,&local_13d4);
      local_13c9 = false;
    }
  }
  local_1430 = 0;
  local_142c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1430);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
            ((Reader *)local_1468,(Reader *)&stack0x00000008);
  local_1434 = List<int,_(capnp::Kind)0>::Reader::size((Reader *)local_1468);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1428,&local_142c,&local_1434);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1428);
  if (!bVar1) {
    local_1469 = kj::_::Debug::shouldLog(ERROR);
    while (local_1469 != false) {
      local_1470 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
                ((Reader *)&_kjCondition_50.result,(Reader *)&stack0x00000008);
      local_1474 = List<int,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_50.result);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fd,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt32List().size())\", _kjCondition, 0u, reader.getInt32List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1428,&local_1470,&local_1474);
      local_1469 = false;
    }
  }
  local_14d0 = 0;
  local_14cc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_14d0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
            ((Reader *)local_1508,(Reader *)&stack0x00000008);
  local_14d4 = List<long,_(capnp::Kind)0>::Reader::size((Reader *)local_1508);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_14c8,&local_14cc,&local_14d4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14c8);
  if (!bVar1) {
    local_1509 = kj::_::Debug::shouldLog(ERROR);
    while (local_1509 != false) {
      local_1510 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
                ((Reader *)&_kjCondition_51.result,(Reader *)&stack0x00000008);
      local_1514 = List<long,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_51.result);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fe,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt64List().size())\", _kjCondition, 0u, reader.getInt64List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_14c8,&local_1510,&local_1514);
      local_1509 = false;
    }
  }
  local_1570 = 0;
  local_156c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1570);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
            ((Reader *)local_15a8,(Reader *)&stack0x00000008);
  local_1574 = List<unsigned_char,_(capnp::Kind)0>::Reader::size((Reader *)local_15a8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1568,&local_156c,&local_1574);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1568);
  if (!bVar1) {
    local_15a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_15a9 != false) {
      local_15b0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
                ((Reader *)&_kjCondition_52.result,(Reader *)&stack0x00000008);
      local_15b4 = List<unsigned_char,_(capnp::Kind)0>::Reader::size
                             ((Reader *)&_kjCondition_52.result);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ff,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt8List().size())\", _kjCondition, 0u, reader.getUInt8List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getUInt8List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1568,&local_15b0,&local_15b4);
      local_15a9 = false;
    }
  }
  local_1610 = 0;
  local_160c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1610);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
            ((Reader *)local_1648,(Reader *)&stack0x00000008);
  local_1614 = List<unsigned_short,_(capnp::Kind)0>::Reader::size((Reader *)local_1648);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1608,&local_160c,&local_1614);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1608);
  if (!bVar1) {
    local_1649 = kj::_::Debug::shouldLog(ERROR);
    while (local_1649 != false) {
      local_1650 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
                ((Reader *)&_kjCondition_53.result,(Reader *)&stack0x00000008);
      local_1654 = List<unsigned_short,_(capnp::Kind)0>::Reader::size
                             ((Reader *)&_kjCondition_53.result);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x200,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt16List().size())\", _kjCondition, 0u, reader.getUInt16List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt16List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1608,&local_1650,&local_1654);
      local_1649 = false;
    }
  }
  local_16b0 = 0;
  local_16ac = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_16b0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
            ((Reader *)local_16e8,(Reader *)&stack0x00000008);
  local_16b4 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_16e8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_16a8,&local_16ac,&local_16b4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_16a8);
  if (!bVar1) {
    local_16e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_16e9 != false) {
      local_16f0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
                ((Reader *)&_kjCondition_54.result,(Reader *)&stack0x00000008);
      local_16f4 = List<unsigned_int,_(capnp::Kind)0>::Reader::size
                             ((Reader *)&_kjCondition_54.result);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x201,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt32List().size())\", _kjCondition, 0u, reader.getUInt32List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_16a8,&local_16f0,&local_16f4);
      local_16e9 = false;
    }
  }
  local_1750 = 0;
  local_174c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1750);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
            ((Reader *)local_1788,(Reader *)&stack0x00000008);
  local_1754 = List<unsigned_long,_(capnp::Kind)0>::Reader::size((Reader *)local_1788);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1748,&local_174c,&local_1754);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1748);
  if (!bVar1) {
    local_1789 = kj::_::Debug::shouldLog(ERROR);
    while (local_1789 != false) {
      local_1790 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
                ((Reader *)&_kjCondition_55.result,(Reader *)&stack0x00000008);
      local_1794 = List<unsigned_long,_(capnp::Kind)0>::Reader::size
                             ((Reader *)&_kjCondition_55.result);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x202,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt64List().size())\", _kjCondition, 0u, reader.getUInt64List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1748,&local_1790,&local_1794);
      local_1789 = false;
    }
  }
  local_17f0 = 0;
  local_17ec = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_17f0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
            ((Reader *)local_1828,(Reader *)&stack0x00000008);
  local_17f4 = List<float,_(capnp::Kind)0>::Reader::size((Reader *)local_1828);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_17e8,&local_17ec,&local_17f4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_17e8);
  if (!bVar1) {
    local_1829 = kj::_::Debug::shouldLog(ERROR);
    while (local_1829 != false) {
      local_1830 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
                ((Reader *)&_kjCondition_56.result,(Reader *)&stack0x00000008);
      local_1834 = List<float,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_56.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x203,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getFloat32List().size())\", _kjCondition, 0u, reader.getFloat32List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (reader.getFloat32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_17e8,&local_1830,&local_1834);
      local_1829 = false;
    }
  }
  local_1890 = 0;
  local_188c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1890);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
            ((Reader *)local_18c8,(Reader *)&stack0x00000008);
  local_1894 = List<double,_(capnp::Kind)0>::Reader::size((Reader *)local_18c8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1888,&local_188c,&local_1894);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1888);
  if (!bVar1) {
    local_18c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_18c9 != false) {
      local_18d0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
                ((Reader *)&_kjCondition_57.result,(Reader *)&stack0x00000008);
      local_18d4 = List<double,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_57.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x204,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getFloat64List().size())\", _kjCondition, 0u, reader.getFloat64List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (reader.getFloat64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1888,&local_18d0,&local_18d4);
      local_18c9 = false;
    }
  }
  local_1930 = 0;
  local_192c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1930);
  capnproto_test::capnp::test::TestAllTypes::Reader::getTextList
            ((Reader *)local_1968,(Reader *)&stack0x00000008);
  local_1934 = List<capnp::Text,_(capnp::Kind)1>::Reader::size((Reader *)local_1968);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1928,&local_192c,&local_1934);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1928);
  if (!bVar1) {
    local_1969 = kj::_::Debug::shouldLog(ERROR);
    while (local_1969 != false) {
      local_1970 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getTextList
                ((Reader *)&_kjCondition_58.result,(Reader *)&stack0x00000008);
      local_1974 = List<capnp::Text,_(capnp::Kind)1>::Reader::size
                             ((Reader *)&_kjCondition_58.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x205,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getTextList().size())\", _kjCondition, 0u, reader.getTextList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getTextList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1928,&local_1970,&local_1974);
      local_1969 = false;
    }
  }
  local_19d0 = 0;
  local_19cc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_19d0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getDataList
            ((Reader *)local_1a08,(Reader *)&stack0x00000008);
  local_19d4 = List<capnp::Data,_(capnp::Kind)1>::Reader::size((Reader *)local_1a08);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_19c8,&local_19cc,&local_19d4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_19c8);
  if (!bVar1) {
    local_1a09 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a09 != false) {
      local_1a10 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getDataList
                ((Reader *)&_kjCondition_59.result,(Reader *)&stack0x00000008);
      local_1a14 = List<capnp::Data,_(capnp::Kind)1>::Reader::size
                             ((Reader *)&_kjCondition_59.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x206,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataList().size())\", _kjCondition, 0u, reader.getDataList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getDataList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_19c8,&local_1a10,&local_1a14);
      local_1a09 = false;
    }
  }
  local_1a70 = 0;
  local_1a6c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a70);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)local_1aa8,(Reader *)&stack0x00000008);
  local_1a74 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                         ((Reader *)local_1aa8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1a68,&local_1a6c,&local_1a74);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a68);
  if (!bVar1) {
    local_1aa9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1aa9 != false) {
      local_1ab0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
                (&local_1ae8,(Reader *)&stack0x00000008);
      local_1ab4 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                             (&local_1ae8);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x207,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getStructList().size())\", _kjCondition, 0u, reader.getStructList().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getStructList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1a68,&local_1ab0,&local_1ab4);
      local_1aa9 = false;
    }
  }
  return;
}

Assistant:

void genericCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(false, reader.getBoolField());
  EXPECT_EQ(0, reader.getInt8Field());
  EXPECT_EQ(0, reader.getInt16Field());
  EXPECT_EQ(0, reader.getInt32Field());
  EXPECT_EQ(0, reader.getInt64Field());
  EXPECT_EQ(0u, reader.getUInt8Field());
  EXPECT_EQ(0u, reader.getUInt16Field());
  EXPECT_EQ(0u, reader.getUInt32Field());
  EXPECT_EQ(0u, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(0, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(0, reader.getFloat64Field());
  EXPECT_EQ("", reader.getTextField());
  EXPECT_EQ(data(""), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(false, subReader.getBoolField());
    EXPECT_EQ(0, subReader.getInt8Field());
    EXPECT_EQ(0, subReader.getInt16Field());
    EXPECT_EQ(0, subReader.getInt32Field());
    EXPECT_EQ(0, subReader.getInt64Field());
    EXPECT_EQ(0u, subReader.getUInt8Field());
    EXPECT_EQ(0u, subReader.getUInt16Field());
    EXPECT_EQ(0u, subReader.getUInt32Field());
    EXPECT_EQ(0u, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(0, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(0, subReader.getFloat64Field());
    EXPECT_EQ("", subReader.getTextField());
    EXPECT_EQ(data(""), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("", subSubReader.getTextField());
      EXPECT_EQ("", subSubReader.getStructField().getTextField());
    }

    EXPECT_EQ(0u, subReader.getVoidList().size());
    EXPECT_EQ(0u, subReader.getBoolList().size());
    EXPECT_EQ(0u, subReader.getInt8List().size());
    EXPECT_EQ(0u, subReader.getInt16List().size());
    EXPECT_EQ(0u, subReader.getInt32List().size());
    EXPECT_EQ(0u, subReader.getInt64List().size());
    EXPECT_EQ(0u, subReader.getUInt8List().size());
    EXPECT_EQ(0u, subReader.getUInt16List().size());
    EXPECT_EQ(0u, subReader.getUInt32List().size());
    EXPECT_EQ(0u, subReader.getUInt64List().size());
    EXPECT_EQ(0u, subReader.getFloat32List().size());
    EXPECT_EQ(0u, subReader.getFloat64List().size());
    EXPECT_EQ(0u, subReader.getTextList().size());
    EXPECT_EQ(0u, subReader.getDataList().size());
    EXPECT_EQ(0u, subReader.getStructList().size());
  }

  EXPECT_EQ(0u, reader.getVoidList().size());
  EXPECT_EQ(0u, reader.getBoolList().size());
  EXPECT_EQ(0u, reader.getInt8List().size());
  EXPECT_EQ(0u, reader.getInt16List().size());
  EXPECT_EQ(0u, reader.getInt32List().size());
  EXPECT_EQ(0u, reader.getInt64List().size());
  EXPECT_EQ(0u, reader.getUInt8List().size());
  EXPECT_EQ(0u, reader.getUInt16List().size());
  EXPECT_EQ(0u, reader.getUInt32List().size());
  EXPECT_EQ(0u, reader.getUInt64List().size());
  EXPECT_EQ(0u, reader.getFloat32List().size());
  EXPECT_EQ(0u, reader.getFloat64List().size());
  EXPECT_EQ(0u, reader.getTextList().size());
  EXPECT_EQ(0u, reader.getDataList().size());
  EXPECT_EQ(0u, reader.getStructList().size());
}